

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

StackSym ** __thiscall
HashTable<StackSym_*,_Memory::ArenaAllocator>::Get
          (HashTable<StackSym_*,_Memory::ArenaAllocator> *this,int value)

{
  SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  Bucket<StackSym_*> *this_00;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type_conflict node;
  Bucket<StackSym_*> *bucket;
  Iterator __iter;
  int value_local;
  HashTable<StackSym_*,_Memory::ArenaAllocator> *this_local;
  
  pSVar1 = this->table;
  __iter.current._4_4_ = value;
  uVar4 = Hash(this,value);
  _bucket = SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                      (pSVar1 + uVar4);
  do {
    if (__iter.list == (SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_00 = bucket;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount> *)this_00,
                       node);
    if (bVar3) goto LAB_00852831;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    this_local = (HashTable<StackSym_*,_Memory::ArenaAllocator> *)
                 SListBase<Bucket<StackSym_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&bucket);
  } while ((int)__iter.current._4_4_ < (int)this_local->tableSize);
  if (this_local->tableSize != __iter.current._4_4_) {
LAB_00852831:
    this_local = (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0;
  }
  return (StackSym **)this_local;
}

Assistant:

T * Get(int value)
    {
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(Bucket<T>, bucket, &this->table[this->Hash(value)])
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return nullptr;
    }